

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_parsing.c
# Opt level: O0

void dump_int_array(nbt_int_array ia,buffer *b)

{
  int local_24;
  int32_t i;
  buffer *b_local;
  nbt_int_array ia_local;
  
  if (-1 < ia.length) {
    bprintf(b,"[ ");
    for (local_24 = 0; local_24 < ia.length; local_24 = local_24 + 1) {
      bprintf(b,"%u ",(ulong)(uint)ia.data[local_24]);
    }
    bprintf(b,"]");
    return;
  }
  __assert_fail("ia.length >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/chmod222[P]cNBT/nbt_parsing.c",
                0x1f0,"void dump_int_array(const struct nbt_int_array, struct buffer *)");
}

Assistant:

static void dump_int_array(const struct nbt_int_array ia, struct buffer* b)
{
    assert(ia.length >= 0);

    bprintf(b, "[ ");
    for(int32_t i = 0; i < ia.length; ++i)
        bprintf(b, "%u ", +ia.data[i]);
    bprintf(b, "]");
}